

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

LPColSetBase<double> * __thiscall
soplex::LPColSetBase<double>::operator=
          (LPColSetBase<double> *this,
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *rs)

{
  if ((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != rs) {
    SVSetBase<double>::operator=
              (&this->super_SVSetBase<double>,
               &rs->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              );
    VectorBase<double>::operator=(&this->low,&rs->low);
    VectorBase<double>::operator=(&this->up,&rs->up);
    VectorBase<double>::operator=(&this->object,&rs->object);
    DataArray<int>::reSize(&this->scaleExp,(rs->scaleExp).thesize);
    memcpy((this->scaleExp).data,(rs->scaleExp).data,(ulong)(uint)(this->scaleExp).thesize << 2);
  }
  return this;
}

Assistant:

LPColSetBase<R>& operator=(const LPColSetBase<S>& rs)
   {
      if(this != (const LPColSetBase<R>*)(&rs))
      {
         SVSetBase<R>::operator=(rs);
         low = rs.low;
         up = rs.up;
         object = rs.object;
         scaleExp = rs.scaleExp;

         assert(isConsistent());
      }

      return *this;
   }